

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::MaybeEmitReceivedTriggers
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet_00;
  Message *this_00;
  pointer pTVar2;
  long lVar3;
  ulong uVar4;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  undefined1 *src;
  size_t in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  long *local_138;
  size_t local_130;
  long local_128 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  anon_unknown_4 *local_100;
  TracingServiceImpl *local_f8;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> local_f0;
  
  uVar4 = tracing_session->num_triggers_emitted_into_trace;
  pTVar2 = (tracing_session->received_triggers).
           super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)(((long)(tracing_session->received_triggers).
                             super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) *
                     -0x3333333333333333)) {
    lVar3 = uVar4 * 0x50;
    local_100 = (anon_unknown_4 *)packets;
    local_f8 = this;
    do {
      protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
                (&local_f0,0x1000,0x1000);
      this_00 = protozero::Message::BeginNestedMessageInternal((Message *)&local_f0.msg_,0x2e);
      local_138 = local_128;
      lVar1 = *(long *)((long)&(pTVar2->trigger_name)._M_dataplus._M_p + lVar3);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,lVar1,
                 *(long *)((long)&(pTVar2->trigger_name)._M_string_length + lVar3) + lVar1);
      protozero::Message::AppendBytes(this_00,1,local_138,local_130);
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      src = &stack0xfffffffffffffeb8;
      lVar1 = *(long *)((long)&(pTVar2->producer_name)._M_dataplus._M_p + lVar3);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffea8,lVar1,
                 *(long *)((long)&(pTVar2->producer_name)._M_string_length + lVar3) + lVar1);
      protozero::Message::AppendBytes(this_00,2,src,in_stack_fffffffffffffeb0);
      if (src != &stack0xfffffffffffffeb8) {
        operator_delete(src,(ulong)(in_stack_fffffffffffffeb8 + 1));
      }
      protozero::Message::AppendVarInt<int>(this_00,3,*(int *)((long)&pTVar2->producer_uid + lVar3))
      ;
      protozero::Message::AppendVarInt<unsigned_long>
                ((Message *)&local_f0.msg_,8,*(unsigned_long *)((long)&pTVar2->boot_time_ns + lVar3)
                );
      protozero::Message::AppendVarInt<int>((Message *)&local_f0.msg_,3,local_f8->uid_);
      protozero::Message::AppendVarInt<unsigned_int>((Message *)&local_f0.msg_,10,1);
      protozero::Message::Finalize((Message *)&local_f0.msg_);
      protozero::ScatteredHeapBuffer::StitchSlices(&local_118,&local_f0.shb_);
      packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffeb0;
      packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = src;
      packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffeb8;
      anon_unknown_4::SerializeAndAppendPacket
                (local_100,
                 (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
                 local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,packet_00);
      if ((vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
          local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      tracing_session->num_triggers_emitted_into_trace =
           tracing_session->num_triggers_emitted_into_trace + 1;
      protozero::MessageArena::~MessageArena(&local_f0.msg_.root_arena_);
      protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_f0.writer_);
      protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_f0.shb_);
      uVar4 = uVar4 + 1;
      pTVar2 = (tracing_session->received_triggers).
               super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar4 < (ulong)(((long)(tracing_session->received_triggers).
                                    super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void TracingServiceImpl::MaybeEmitReceivedTriggers(
    TracingSession* tracing_session,
    std::vector<TracePacket>* packets) {
  PERFETTO_DCHECK(tracing_session->num_triggers_emitted_into_trace <=
                  tracing_session->received_triggers.size());
  for (size_t i = tracing_session->num_triggers_emitted_into_trace;
       i < tracing_session->received_triggers.size(); ++i) {
    const auto& info = tracing_session->received_triggers[i];
    protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
    auto* trigger = packet->set_trigger();
    trigger->set_trigger_name(info.trigger_name);
    trigger->set_producer_name(info.producer_name);
    trigger->set_trusted_producer_uid(static_cast<int32_t>(info.producer_uid));

    packet->set_timestamp(info.boot_time_ns);
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
    SerializeAndAppendPacket(packets, packet.SerializeAsArray());
    ++tracing_session->num_triggers_emitted_into_trace;
  }
}